

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

int tpl_worker_hook(void *arg1,void *unused)

{
  TplTxfmStats *tpl_txfm_stats;
  byte bVar1;
  byte bVar2;
  TX_SIZE tx_size;
  uint uVar3;
  AV1_COMP *cpi;
  MACROBLOCK *x;
  pthread_mutex_t *__mutex;
  AV1_PRIMARY *pAVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  
  cpi = *arg1;
  x = *(MACROBLOCK **)((long)arg1 + 8);
  iVar10 = (cpi->ppi->tpl_data).tpl_mt_sync.num_threads_working;
  (x->e_mbd).error_info = (aom_internal_error_info *)((long)arg1 + 0x18);
  __mutex = (cpi->mt_info).tpl_row_mt.mutex_;
  iVar5 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar5 == 0) {
    tpl_txfm_stats = (TplTxfmStats *)(x[1].e_mbd.plane[0].seg_qmatrix[0] + 3);
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    bVar1 = (cpi->ppi->tpl_data).tpl_bsize_1d;
    if (bVar1 < 0x10) {
      if (bVar1 == 4) {
        uVar8 = 0;
        goto LAB_001cbc13;
      }
      if (bVar1 == 8) {
        uVar8 = 3;
        goto LAB_001cbc13;
      }
    }
    else if (bVar1 != 0x10) {
      uVar8 = 0xc;
      if (bVar1 == 0x40) goto LAB_001cbc13;
      if (bVar1 == 0x20) {
        uVar8 = 9;
        goto LAB_001cbc13;
      }
    }
    uVar8 = 6;
LAB_001cbc13:
    tx_size = ""[uVar8];
    bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar8];
    av1_init_tpl_txfm_stats(tpl_txfm_stats);
    uVar3 = *(uint *)((long)arg1 + 0x1c8);
    iVar6 = uVar3 * bVar1;
    iVar5 = (cpi->common).mi_params.mi_rows;
    if (iVar6 < iVar5) {
      iVar10 = iVar10 * (uint)bVar1;
      uVar19 = (uint)bVar1;
      iVar11 = uVar3 * uVar19;
      iVar18 = iVar11 * -4 + 8;
      iVar15 = iVar11 * -0x20;
      iVar12 = (uVar3 + 1) * uVar19;
      iVar16 = iVar12 * -4 + -8;
      iVar17 = 0;
      do {
        iVar14 = (cpi->oxcf).border_in_pixels;
        iVar13 = iVar18 - iVar14;
        if (iVar13 <= iVar16) {
          iVar13 = iVar16;
        }
        (x->mv_limits).row_min = iVar13;
        iVar13 = (cpi->common).mi_params.mi_rows;
        iVar7 = iVar14 + (iVar17 + ~uVar3 * uVar19 + iVar13) * 4 + -8;
        iVar14 = ((iVar17 - iVar11) + iVar13) * 4 + 8;
        if (iVar7 < iVar14) {
          iVar14 = iVar7;
        }
        (x->mv_limits).row_max = iVar14;
        (x->e_mbd).mb_to_top_edge = iVar15;
        (x->e_mbd).mb_to_bottom_edge = ((iVar5 - iVar12) + iVar17) * 0x20;
        av1_mc_flow_dispenser_row
                  (cpi,tpl_txfm_stats,(TplBuffers *)(x[1].e_mbd.plane[0].seg_iqmatrix[7] + 0x11),x,
                   iVar6,(BLOCK_SIZE)uVar8,tx_size);
        iVar6 = iVar6 + iVar10;
        iVar5 = (cpi->common).mi_params.mi_rows;
        iVar18 = iVar18 + iVar10 * -4;
        iVar15 = iVar15 + iVar10 * -0x20;
        iVar17 = iVar17 - iVar10;
        iVar16 = iVar16 + iVar10 * -4;
      } while (iVar6 < iVar5);
    }
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    return 1;
  }
  *(undefined4 *)((long)arg1 + 0xe8) = 0;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  (cpi->mt_info).tpl_row_mt.tpl_mt_exit = true;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pAVar4 = cpi->ppi;
  bVar1 = (pAVar4->tpl_data).tpl_bsize_1d;
  if (bVar1 < 0x10) {
    if (bVar1 == 4) {
      lVar9 = 0;
      goto LAB_001cbb95;
    }
    if (bVar1 == 8) {
      lVar9 = 3;
      goto LAB_001cbb95;
    }
  }
  else if (bVar1 != 0x10) {
    lVar9 = 0xc;
    if (bVar1 == 0x40) goto LAB_001cbb95;
    if (bVar1 == 0x20) {
      lVar9 = 9;
      goto LAB_001cbb95;
    }
  }
  lVar9 = 6;
LAB_001cbb95:
  bVar1 = ""[lVar9] & 0x1f;
  iVar10 = ((1 << (""[lVar9] & 0x1f)) >> 1) + (cpi->common).mi_params.mi_cols >> bVar1;
  if (0 < (cpi->common).mi_params.mi_rows) {
    bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[lVar9];
    iVar6 = 0 >> bVar1;
    iVar5 = iVar6;
    do {
      iVar5 = iVar5 + (uint)bVar2;
      (*(cpi->mt_info).tpl_row_mt.sync_write_ptr)
                (&(pAVar4->tpl_data).tpl_mt_sync,iVar6,iVar10 + -1,iVar10);
      iVar6 = iVar6 + 1;
    } while (iVar5 < (cpi->common).mi_params.mi_rows);
  }
  return 0;
}

Assistant:

static int tpl_worker_hook(void *arg1, void *unused) {
  (void)unused;
  EncWorkerData *thread_data = (EncWorkerData *)arg1;
  AV1_COMP *cpi = thread_data->cpi;
  AV1_COMMON *cm = &cpi->common;
  MACROBLOCK *x = &thread_data->td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  TplTxfmStats *tpl_txfm_stats = &thread_data->td->tpl_txfm_stats;
  TplBuffers *tpl_tmp_buffers = &thread_data->td->tpl_tmp_buffers;
  CommonModeInfoParams *mi_params = &cm->mi_params;
  int num_active_workers = cpi->ppi->tpl_data.tpl_mt_sync.num_threads_working;

  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  xd->error_info = error_info;
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &cpi->mt_info.tpl_row_mt;
  (void)tpl_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *tpl_error_mutex_ = tpl_row_mt->mutex_;
#endif

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(tpl_error_mutex_);
    tpl_row_mt->tpl_mt_exit = true;
    pthread_mutex_unlock(tpl_error_mutex_);
#endif
    set_mode_estimation_done(cpi);
    return 0;
  }
  error_info->setjmp = 1;

  BLOCK_SIZE bsize = convert_length_to_bsize(cpi->ppi->tpl_data.tpl_bsize_1d);
  TX_SIZE tx_size = max_txsize_lookup[bsize];
  int mi_height = mi_size_high[bsize];

  av1_init_tpl_txfm_stats(tpl_txfm_stats);

  for (int mi_row = thread_data->start * mi_height; mi_row < mi_params->mi_rows;
       mi_row += num_active_workers * mi_height) {
    // Motion estimation row boundary
    av1_set_mv_row_limits(mi_params, &x->mv_limits, mi_row, mi_height,
                          cpi->oxcf.border_in_pixels);
    xd->mb_to_top_edge = -GET_MV_SUBPEL(mi_row * MI_SIZE);
    xd->mb_to_bottom_edge =
        GET_MV_SUBPEL((mi_params->mi_rows - mi_height - mi_row) * MI_SIZE);
    av1_mc_flow_dispenser_row(cpi, tpl_txfm_stats, tpl_tmp_buffers, x, mi_row,
                              bsize, tx_size);
  }
  error_info->setjmp = 0;
  return 1;
}